

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar_p.h
# Opt level: O1

void __thiscall QMenuBarPrivate::QMenuBarPrivate(QMenuBarPrivate *this)

{
  undefined1 *puVar1;
  
  QWidgetPrivate::QWidgetPrivate(&this->super_QWidgetPrivate,QObjectPrivateVersion);
  *(undefined ***)&this->super_QWidgetPrivate = &PTR__QMenuBarPrivate_00805bb8;
  puVar1 = &(this->super_QWidgetPrivate).field_0x254;
  *puVar1 = *puVar1 & 0xfe;
  (this->shortcutIndexMap).d.d = (Data *)0x0;
  (this->shortcutIndexMap).d.ptr = (int *)0x0;
  (this->shortcutIndexMap).d.size = 0;
  (this->actionRects).d.d = (Data *)0x0;
  (this->actionRects).d.ptr = (QRect *)0x0;
  (this->actionRects).d.size = 0;
  (this->currentAction).wp.d = (Data *)0x0;
  (this->currentAction).wp.value = (QObject *)0x0;
  this->field_0x298 = this->field_0x298 & 0xfc;
  this->defaultPopDown = 1;
  this->field_0x2a0 = this->field_0x2a0 & 0xfe;
  (this->activeMenu).wp.d = (Data *)0x0;
  (this->activeMenu).wp.value = (QObject *)0x0;
  this->field_0x2b8 = this->field_0x2b8 & 0xfc;
  this->doChildEffects = false;
  this->platformMenuBar = (QPlatformMenuBar *)0x0;
  (this->keyboardFocusWidget).wp.d = (Data *)0x0;
  (this->keyboardFocusWidget).wp.value = (QObject *)0x0;
  (this->leftWidget).wp.d = (Data *)0x0;
  (this->leftWidget).wp.value = (QObject *)0x0;
  (this->rightWidget).wp.d = (Data *)0x0;
  (this->rightWidget).wp.value = (QObject *)0x0;
  (this->defaultAction).wp.d = (Data *)0x0;
  (this->defaultAction).wp.value = (QObject *)0x0;
  (this->hiddenActions).d.ptr = (QAction **)0x0;
  (this->hiddenActions).d.size = 0;
  (this->oldParents).d.size = 0;
  (this->hiddenActions).d.d = (Data *)0x0;
  (this->oldParents).d.d = (Data *)0x0;
  (this->oldParents).d.ptr = (QPointer<QWidget> *)0x0;
  (this->autoReleaseTimer).m_id = Invalid;
  return;
}

Assistant:

QMenuBarPrivate() : itemsDirty(0), currentAction(nullptr), mouseDown(0),
                         closePopupMode(0), defaultPopDown(1), popupState(0), keyboardState(0), altPressed(0),
                         doChildEffects(false), platformMenuBar(nullptr)
    { }